

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

char * Scl_LibertyFindMatch(char *pPos,char *pEnd)

{
  int local_1c;
  int Counter;
  char *pEnd_local;
  char *pPos_local;
  
  local_1c = 0;
  if ((*pPos != '(') && (*pPos != '{')) {
    __assert_fail("*pPos == \'(\' || *pPos == \'{\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                  ,0x10a,"char *Scl_LibertyFindMatch(char *, char *)");
  }
  pEnd_local = pPos;
  if (*pPos == '(') {
    for (; pEnd_local < pEnd; pEnd_local = pEnd_local + 1) {
      if (*pEnd_local == '(') {
        local_1c = local_1c + 1;
      }
      if (*pEnd_local == ')') {
        local_1c = local_1c + -1;
      }
      if (local_1c == 0) break;
    }
  }
  else {
    for (; pEnd_local < pEnd; pEnd_local = pEnd_local + 1) {
      if (*pEnd_local == '{') {
        local_1c = local_1c + 1;
      }
      if (*pEnd_local == '}') {
        local_1c = local_1c + -1;
      }
      if (local_1c == 0) break;
    }
  }
  if ((*pEnd_local != ')') && (*pEnd_local != '}')) {
    __assert_fail("*pPos == \')\' || *pPos == \'}\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                  ,0x123,"char *Scl_LibertyFindMatch(char *, char *)");
  }
  return pEnd_local;
}

Assistant:

static inline char * Scl_LibertyFindMatch( char * pPos, char * pEnd )
{
    int Counter = 0;
    assert( *pPos == '(' || *pPos == '{' );
    if ( *pPos == '(' )
    {
        for ( ; pPos < pEnd; pPos++ )
        {
            if ( *pPos == '(' )
                Counter++;
            if ( *pPos == ')' )
                Counter--;
            if ( Counter == 0 )
                break;
        }
    }
    else
    {
        for ( ; pPos < pEnd; pPos++ )
        {
            if ( *pPos == '{' )
                Counter++;
            if ( *pPos == '}' )
                Counter--;
            if ( Counter == 0 )
                break;
        }
    }
    assert( *pPos == ')' || *pPos == '}' );
    return pPos;
}